

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

void __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::serror(SOLReader2<mp::SOLHandler_Easy> *this,char *format,...)

{
  char in_AL;
  size_type __n;
  char *pcVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int n1;
  vector<char,_std::allocator<char>_> buf;
  int n;
  va_list args;
  allocator_type *__a;
  vector<char,_std::allocator<char>_> *this_00;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_60;
  vector<char,_std::allocator<char>_> local_49;
  int local_2c;
  undefined4 local_28;
  undefined4 local_24;
  allocator_type *local_20;
  undefined1 *local_18;
  char *local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  __a = (allocator_type *)&stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_20 = __a;
  local_18 = local_118;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2c = vsnprintf((char *)0x0,0,in_RSI,&local_28);
  local_24 = 0x30;
  local_28 = 0x10;
  __n = (size_type)(local_2c + 1);
  this_00 = &local_49;
  local_20 = __a;
  local_18 = local_118;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this_00,__n,__a);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x13d85d);
  local_60 = vsnprintf(pcVar1,(long)(local_2c + 1),local_10,&local_28);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x140),'\n');
  }
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x13d915);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x140),pcVar1);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)__a);
  return;
}

Assistant:

void SOLReader2<SOLHandler>::serror(
    const char* format, ...) {
  va_list args;
  va_start (args, format);
  auto n = std::vsnprintf (0, 0, format, args);
  va_end (args);
  va_start (args, format);
  std::vector<char> buf(n+1);
  auto n1 = std::vsnprintf (buf.data(), n+1, format, args);
  assert(n==n1);
  va_end (args);
  if (err_msg_.size())
    err_msg_ += '\n';
  err_msg_ += buf.data();
}